

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O3

void __thiscall Graph::auxForward(Graph *this,Vertex *vertex,Edge *edge,int it)

{
  Vertex *pVVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Edge *pEVar5;
  Edge *edge_00;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double local_90;
  undefined1 local_88 [12];
  undefined4 uStack_7c;
  int local_6c;
  double local_68;
  double dStack_60;
  Edge *local_50;
  double local_48;
  undefined8 uStack_40;
  
  if (vertex == (Vertex *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n No NULL \n",0xb);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
    return;
  }
  edge_00 = vertex->edgesList;
  local_6c = it;
  do {
    if (edge_00 == (Edge *)0x0) {
      return;
    }
    while (edge_00->closed == false) {
      edge_00->activePowerFlow = 0.0;
      edge_00->reactivePowerFlow = 0.0;
      edge_00->activeLoss = 0.0;
      edge_00->reactiveLoss = 0.0;
      edge_00 = edge_00->nextEdge;
      if (edge_00 == (Edge *)0x0) {
        return;
      }
    }
    local_50 = edge;
    if (this->verticesList == vertex) {
      pVVar1 = edge_00->destiny;
      local_90 = Vertex::getActivePower(pVVar1);
      auxBranchActiveLoss(this,pVVar1,&local_90);
      stack0xffffffffffffff80 = 0.0;
      local_88._0_8_ = local_90;
      pVVar1 = edge_00->destiny;
      local_90 = Vertex::getReactivePower(pVVar1);
      auxBranchReactiveLoss(this,pVVar1,&local_90);
      dVar7 = edge_00->activeLoss + (double)local_88._0_8_;
      dVar8 = edge_00->reactiveLoss + local_90;
      auVar4._8_4_ = SUB84(dVar8,0);
      auVar4._0_8_ = dVar7;
      auVar4._12_4_ = (int)((ulong)dVar8 >> 0x20);
      edge_00->activePowerFlow = dVar7;
      edge_00->reactivePowerFlow = (double)auVar4._8_8_;
    }
    else {
      local_68 = edge->activePowerFlow;
      if (it < 1) {
        _local_88 = ZEXT816(0);
      }
      else {
        dVar8 = edge->reactivePowerFlow * edge->reactivePowerFlow + local_68 * local_68;
        dVar7 = edge->origin->voltage;
        dVar7 = dVar7 * dVar7;
        auVar9._0_8_ = dVar8 * edge->resistance;
        auVar9._8_8_ = dVar8 * edge->reactance;
        auVar2._8_4_ = SUB84(dVar7,0);
        auVar2._0_8_ = dVar7;
        auVar2._12_4_ = (int)((ulong)dVar7 >> 0x20);
        _local_88 = divpd(auVar9,auVar2);
      }
      local_68 = local_68 - local_88._0_8_;
      dVar7 = Vertex::getActivePower(vertex);
      edge_00->activePowerFlow = local_68 - dVar7;
      local_88._0_8_ = edge->reactivePowerFlow - stack0xffffffffffffff80;
      stack0xffffffffffffff80 = 0.0;
      dVar7 = Vertex::getReactivePower(vertex);
      dVar7 = (double)local_88._0_8_ - dVar7;
      edge_00->reactivePowerFlow = dVar7;
      if (1 < edge_00->origin->outdegree) {
        pEVar5 = vertex->edgesList;
        dVar8 = 0.0;
        dVar6 = 0.0;
        if (pEVar5 != (Edge *)0x0) {
          do {
            if ((pEVar5 != edge_00) && (pEVar5->closed == true)) {
              pVVar1 = pEVar5->destiny;
              stack0xffffffffffffff80 = 0.0;
              local_88._0_8_ = pEVar5->activeLoss;
              local_68 = dVar8;
              dStack_60 = dVar6;
              local_90 = Vertex::getActivePower(pVVar1);
              auxBranchActiveLoss(this,pVVar1,&local_90);
              local_48 = local_90;
              uStack_40 = 0;
              pVVar1 = pEVar5->destiny;
              local_88._8_4_ = SUB84(pEVar5->reactiveLoss,0);
              uStack_7c = (int)((ulong)pEVar5->reactiveLoss >> 0x20);
              local_90 = Vertex::getReactivePower(pVVar1);
              auxBranchReactiveLoss(this,pVVar1,&local_90);
              dVar8 = local_68 + local_48 + (double)local_88._0_8_;
              dVar6 = dStack_60 + local_90 + stack0xffffffffffffff80;
            }
            pEVar5 = pEVar5->nextEdge;
          } while (pEVar5 != (Edge *)0x0);
          dVar7 = edge_00->reactivePowerFlow;
        }
        dVar8 = edge_00->activePowerFlow - dVar8;
        auVar3._8_4_ = SUB84(dVar7 - dVar6,0);
        auVar3._0_8_ = dVar8;
        auVar3._12_4_ = (int)((ulong)(dVar7 - dVar6) >> 0x20);
        edge_00->activePowerFlow = dVar8;
        edge_00->reactivePowerFlow = (double)auVar3._8_8_;
        it = local_6c;
      }
    }
    auxForward(this,edge_00->destiny,edge_00,it);
    edge_00 = edge_00->nextEdge;
    edge = local_50;
  } while( true );
}

Assistant:

void Graph::auxForward(Vertex *vertex, Edge *edge, int it){
    if(vertex == NULL)
        cout<<"\n No NULL \n"<<endl;
    else{
        for(Edge *e = vertex->getEdgesList(); e!=NULL; e= e->getNext()){

            double active_power     = 0.0;
            double reactive_power   = 0.0;

            /// set open edges with flow-free
            while(e!=NULL && !e->isClosed() ){

                e->setActiveFlow(0.0);
                e->setReactiveFlow(0.0);
                e->setActiveLoss(0.0);
                e->setReactiveLoss(0.0);

                e = e->getNext();
            }
            if(e==NULL)
                break;

            //chute inicial para o fluxo nas arests que partem do no terminal
            if( vertex==this->verticesList ) {
                double activeLossCharge = branchActiveLoss(e->getDestiny());
                double reactiveLossCharge = branchReactiveLoss(e->getDestiny());

                e->setActiveFlow(activeLossCharge + e->getActiveLoss());
                e->setReactiveFlow(reactiveLossCharge + e->getReactiveLoss());

            } else {
                //a partir da primeira iteracao considera-se a perda calculada na iteracao anterior
                if(it>0){
                    active_power = edge->getResistance()*(pow(edge->getActivePowerFlow(), 2) + pow(edge->getReactivePowerFlow(), 2)) / pow(
                            edge->getOrigin()->getVoltage(), 2);    // Q = R*P^2 + Q^2/V^2
                    reactive_power =
                            edge->getReactance()*(pow(edge->getActivePowerFlow(), 2) + pow(edge->getReactivePowerFlow(), 2)) / pow(
                                    edge->getOrigin()->getVoltage(), 2);
                }

                e->setActiveFlow(edge->getActivePowerFlow() - active_power - vertex->getActivePower());
                e->setReactiveFlow(edge->getReactivePowerFlow() - reactive_power - vertex->getReactivePower());

                //bifurcacao - o fluxo que seque para o arco 'a' deve-se subtrair a soma de cargas e perdas dos ramos de bifurcacoes
                if(e->getOrigin()->getIndegree()>1){
                    double somaAtiv=0.0, somaReAtiv=0.0;
                    for(Edge *aux= vertex->getEdgesList(); aux!=NULL; aux= aux->getNext()){
                        if(aux!=e && aux->isClosed()==true){
                            somaAtiv+= aux->getActiveLoss() + branchActiveLoss(aux->getDestiny());
                            somaReAtiv+= aux->getReactiveLoss() + branchReactiveLoss(aux->getDestiny());
                        }
                    }

                    e->setActiveFlow(e->getActivePowerFlow() - somaAtiv);
                    e->setReactiveFlow(e->getReactivePowerFlow() - somaReAtiv);
                }
            }

            auxForward(e->getDestiny(), e, it);
        }
    }
}